

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

void glcts::GeometryShaderLayeredFBOShared::initFBOs
               (Functions *gl,glFramebufferTextureFunc pGLFramebufferTexture,GLuint *to_ids,
               GLuint *out_fbo_ids)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLenum GVar11;
  uint n_fbo_d_draw_buffers;
  uint n_fbo_c_draw_buffers;
  uint n_fbo_b_draw_buffers;
  uint n_fbo_a_draw_buffers;
  GLuint fbo_id_d;
  GLuint fbo_id_c;
  GLuint fbo_id_b;
  GLuint fbo_id_a;
  GLenum fbo_d_draw_buffers [2];
  GLenum fbo_c_draw_buffers [1];
  GLenum fbo_b_draw_buffers [3];
  GLenum fbo_a_draw_buffers [3];
  GLuint to_id_f;
  GLuint to_id_e;
  GLuint to_id_d;
  GLuint to_id_c;
  GLuint to_id_b;
  GLuint to_id_a_prim;
  GLuint to_id_a;
  GLuint *out_fbo_ids_local;
  GLuint *to_ids_local;
  glFramebufferTextureFunc pGLFramebufferTexture_local;
  Functions *gl_local;
  
  GVar1 = *to_ids;
  GVar2 = to_ids[1];
  GVar3 = to_ids[2];
  GVar4 = to_ids[3];
  GVar5 = to_ids[4];
  GVar6 = to_ids[5];
  GVar7 = to_ids[6];
  (*gl->genFramebuffers)(4,out_fbo_ids);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glGenFramebuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x7f);
  fbo_b_draw_buffers[1] = 0x8ce0;
  fbo_b_draw_buffers[2] = 0;
  stack0xffffffffffffffa4 = 0x8ce100008ce0;
  fbo_b_draw_buffers[0] = 0x8ce2;
  fbo_d_draw_buffers[0] = 0x8ce0;
  _fbo_id_b = 0x8ce100008ce0;
  GVar8 = out_fbo_ids[1];
  GVar9 = out_fbo_ids[2];
  GVar10 = out_fbo_ids[3];
  (*gl->bindFramebuffer)(0x8ca9,*out_fbo_ids);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x90);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce0,GVar1,0);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce2,GVar3,0);
  (*pGLFramebufferTexture)(0x8ca9,0x8d00,GVar2,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTexture() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x95);
  (*gl->drawBuffers)(3,fbo_b_draw_buffers + 1);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glDrawBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x98);
  (*gl->bindFramebuffer)(0x8ca9,GVar8);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x9c);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce0,GVar4,0);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce1,GVar1,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTexture() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xa0);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce2,GVar5,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTextureLayer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xa3);
  (*gl->drawBuffers)(3,fbo_d_draw_buffers + 1);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glDrawBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xa6);
  (*gl->bindFramebuffer)(0x8ca9,GVar9);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xaa);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce0,GVar5,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTextureLayer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xad);
  (*pGLFramebufferTexture)(0x8ca9,0x8d00,GVar2,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xb0);
  (*gl->drawBuffers)(1,fbo_d_draw_buffers);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glDrawBufers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xb3);
  (*gl->bindFramebuffer)(0x8ca9,GVar10);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xb7);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce0,GVar6,0);
  (*pGLFramebufferTexture)(0x8ca9,0x8ce1,GVar7,0);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glFramebufferTexture() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xbb);
  (*gl->drawBuffers)(2,&fbo_id_b);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glDrawBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xbe);
  return;
}

Assistant:

void GeometryShaderLayeredFBOShared::initFBOs(const glw::Functions&			gl,
											  glw::glFramebufferTextureFunc pGLFramebufferTexture,
											  const glw::GLuint* to_ids, glw::GLuint* out_fbo_ids)
{
	const glw::GLuint to_id_a	  = to_ids[0];
	const glw::GLuint to_id_a_prim = to_ids[1];
	const glw::GLuint to_id_b	  = to_ids[2];
	const glw::GLuint to_id_c	  = to_ids[3];
	const glw::GLuint to_id_d	  = to_ids[4];
	const glw::GLuint to_id_e	  = to_ids[5];
	const glw::GLuint to_id_f	  = to_ids[6];

	gl.genFramebuffers(n_shared_fbo_ids, out_fbo_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	/* Set up framebuffer object A */
	const glw::GLenum  fbo_a_draw_buffers[] = { GL_COLOR_ATTACHMENT0, GL_NONE, GL_COLOR_ATTACHMENT2 };
	const glw::GLenum  fbo_b_draw_buffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2 };
	const glw::GLenum  fbo_c_draw_buffers[] = { GL_COLOR_ATTACHMENT0 };
	const glw::GLenum  fbo_d_draw_buffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
	const glw::GLuint  fbo_id_a				= out_fbo_ids[0];
	const glw::GLuint  fbo_id_b				= out_fbo_ids[1];
	const glw::GLuint  fbo_id_c				= out_fbo_ids[2];
	const glw::GLuint  fbo_id_d				= out_fbo_ids[3];
	const unsigned int n_fbo_a_draw_buffers = sizeof(fbo_a_draw_buffers) / sizeof(fbo_a_draw_buffers[0]);
	const unsigned int n_fbo_b_draw_buffers = sizeof(fbo_b_draw_buffers) / sizeof(fbo_b_draw_buffers[0]);
	const unsigned int n_fbo_c_draw_buffers = sizeof(fbo_c_draw_buffers) / sizeof(fbo_c_draw_buffers[0]);
	const unsigned int n_fbo_d_draw_buffers = sizeof(fbo_d_draw_buffers) / sizeof(fbo_d_draw_buffers[0]);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id_a);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_id_a, 0);	 /* level */
	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, to_id_b, 0);	 /* level */
	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, to_id_a_prim, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture() call(s) failed.");

	gl.drawBuffers(n_fbo_a_draw_buffers, fbo_a_draw_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers() call failed.");

	/* Set up framebuffer object B */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id_b);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_id_c, 0); /* level */
	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to_id_a, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture() call(s) failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, to_id_d, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");

	gl.drawBuffers(n_fbo_b_draw_buffers, fbo_b_draw_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers() call failed.");

	/* Set up framebuffer object C */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id_c);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_id_d, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, to_id_a_prim, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture() call failed.");

	gl.drawBuffers(n_fbo_c_draw_buffers, fbo_c_draw_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBufers() call failed.");

	/* Set up framebuffer object D */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id_d);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_id_e, 0); /* level */
	pGLFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to_id_f, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture() call(s) failed.");

	gl.drawBuffers(n_fbo_d_draw_buffers, fbo_d_draw_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers() call failed.");
}